

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_top_k(ggml_context *ctx,ggml_tensor *a,int k)

{
  ggml_tensor *pgVar1;
  int in_EDX;
  int64_t unaff_RBX;
  long in_RSI;
  int64_t in_RDI;
  int64_t unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  ggml_context *in_stack_00000010;
  ggml_tensor *result;
  undefined4 in_stack_00000028;
  undefined8 in_stack_ffffffffffffffc0;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RSI + 0x10) < (long)in_EDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x111e,"GGML_ASSERT(%s) failed","a->ne[0] >= k");
  }
  ggml_argsort(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (ggml_sort_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pgVar1 = ggml_view_4d(in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI,
                        (size_t)result,CONCAT44(k,in_stack_00000028),(size_t)a,(size_t)ctx);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_top_k(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   k) {
    GGML_ASSERT(a->ne[0] >= k);

    struct ggml_tensor * result = ggml_argsort(ctx, a, GGML_SORT_ORDER_DESC);

    result = ggml_view_4d(ctx, result,
                k, result->ne[1], result->ne[2], result->ne[3],
                   result->nb[1], result->nb[2], result->nb[3],
                0);

    return result;
}